

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void ssh_ecdhkex_m_getpublic(ecdh_key *dh,BinarySink *bs)

{
  BinarySink *bs_00;
  uint8_t val;
  ulong local_30;
  size_t i;
  mp_int *x;
  ecdh_key_m *dhm;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  
  x = (mp_int *)(dh + -4);
  dhm = (ecdh_key_m *)bs;
  bs_local = (BinarySink *)dh;
  ecc_montgomery_get_affine((MontgomeryPoint *)dh[-1].vt,(mp_int **)&i);
  for (local_30 = 0; local_30 < x->w[4]; local_30 = local_30 + 1) {
    bs_00 = (BinarySink *)dhm->private;
    val = mp_get_byte((mp_int *)i,local_30);
    BinarySink_put_byte(bs_00,val);
  }
  mp_free((mp_int *)i);
  return;
}

Assistant:

static void ssh_ecdhkex_m_getpublic(ecdh_key *dh, BinarySink *bs)
{
    ecdh_key_m *dhm = container_of(dh, ecdh_key_m, ek);
    mp_int *x;
    ecc_montgomery_get_affine(dhm->m_public, &x);
    for (size_t i = 0; i < dhm->curve->fieldBytes; ++i)
        put_byte(bs, mp_get_byte(x, i));
    mp_free(x);
}